

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManDumpAll(If_DsdMan_t *p,int Support)

{
  long lVar1;
  word *pRes;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *__s;
  int iVar6;
  long lVar7;
  word *pwVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  __s = fopen("tts_all.txt","wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","tts_all.txt");
    return;
  }
  if (0 < (p->vObjs).nSize) {
    iVar3 = 6;
    if (6 < Support) {
      iVar3 = Support;
    }
    lVar7 = 0;
    do {
      if ((Support == 0) || ((*(uint *)((long)(p->vObjs).pArray[lVar7] + 4) >> 3 & 0x1f) == Support)
         ) {
        pRes = p->pTtElems[0xc];
        If_DsdManComputeTruthPtr(p,(int)lVar7 * 2,(uchar *)0x0,pRes);
        fwrite("0x",2,1,__s);
        iVar4 = iVar3;
        if (Support == 0) {
          iVar4 = p->nVars;
        }
        if (iVar4 < 2) {
          __assert_fail("nVars >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
        }
        iVar6 = 1 << ((char)iVar4 - 6U & 0x1f);
        if (iVar4 < 7) {
          iVar6 = 1;
        }
        pwVar8 = pRes + (long)iVar6 + -1;
        if (pRes <= pwVar8) {
          uVar5 = ~(-1 << ((char)iVar4 - 2U & 0x1f));
          if (5 < iVar4) {
            uVar5 = 0xf;
          }
          lVar1 = (ulong)uVar5 + 1;
          lVar10 = (ulong)uVar5 << 2;
          lVar9 = lVar10;
          lVar11 = lVar1;
          do {
            uVar5 = (uint)(*pwVar8 >> ((byte)lVar9 & 0x3c)) & 0xf;
            iVar4 = uVar5 + 0x30;
            if (9 < uVar5) {
              iVar4 = uVar5 + 0x37;
            }
            fputc(iVar4,__s);
            lVar12 = lVar11 + -1;
            bVar2 = 0 < lVar11;
            lVar9 = lVar9 + -4;
            lVar11 = lVar12;
          } while ((lVar12 != 0 && bVar2) ||
                  (pwVar8 = pwVar8 + -1, lVar9 = lVar10, lVar11 = lVar1, pRes <= pwVar8));
        }
        fputc(10,__s);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vObjs).nSize);
  }
  fclose(__s);
  return;
}

Assistant:

void If_DsdManDumpAll( If_DsdMan_t * p, int Support )
{
    extern word * If_DsdManComputeTruth( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits );
    char * pFileName = "tts_all.txt";
    If_DsdObj_t * pObj;
    word * pRes; int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        if ( Support && Support != If_DsdObjSuppSize(pObj) )
            continue;
        pRes = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
        fprintf( pFile, "0x" );
        Abc_TtPrintHexRev( pFile, pRes, Support ? Abc_MaxInt(Support, 6) : p->nVars );
        fprintf( pFile, "\n" );
//        printf( "    " );
//        Dau_DsdPrintFromTruth( pRes, p->nVars );
    }
    fclose( pFile );
}